

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,unsigned_long *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          unsigned_long *args_2,unsigned_long *args_3)

{
  unsigned_long x;
  unsigned_long x_00;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string local_e0;
  string local_c0 [32];
  string local_a0;
  string local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  char *local_48;
  Printer *local_40;
  allocator_type local_31;
  
  local_40 = this->printer_;
  local_48 = format;
  ToString<unsigned_long,void>(&local_e0,(Formatter *)*args,(unsigned_long)args);
  std::__cxx11::string::string(local_c0,(string *)args_1);
  ToString<unsigned_long,void>(&local_a0,(Formatter *)*args_2,x);
  ToString<unsigned_long,void>(&local_80,(Formatter *)*args_3,x_00);
  __l._M_len = 4;
  __l._M_array = &local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,__l,&local_31);
  google::protobuf::io::Printer::FormatInternal
            ((vector *)local_40,(map *)&local_60,(char *)&this->vars_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_e0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }